

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemButton(char *label,ImGuiTabItemFlags flags)

{
  bool bVar1;
  
  if (GImGui->CurrentWindow->SkipItems != false) {
    return false;
  }
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    bVar1 = TabItemEx(GImGui->CurrentTabBar,label,(bool *)0x0,flags | 0x200020);
    return bVar1;
  }
  __assert_fail("(tab_bar != __null) && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                ,0x1e1e,"bool ImGui::TabItemButton(const char *, ImGuiTabItemFlags)");
}

Assistant:

bool    ImGui::TabItemButton(const char* label, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    return TabItemEx(tab_bar, label, NULL, flags | ImGuiTabItemFlags_Button | ImGuiTabItemFlags_NoReorder);
}